

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_code_deflate(archive *a,la_zstream *lastrm,la_zaction action)

{
  z_streamp strm_00;
  uint uVar1;
  int r;
  z_stream *strm;
  la_zaction action_local;
  la_zstream *lastrm_local;
  archive *a_local;
  
  strm_00 = (z_streamp)lastrm->real_stream;
  strm_00->next_in = lastrm->next_in;
  strm_00->avail_in = (uInt)lastrm->avail_in;
  strm_00->total_in = lastrm->total_in;
  strm_00->next_out = lastrm->next_out;
  strm_00->avail_out = (uInt)lastrm->avail_out;
  strm_00->total_out = lastrm->total_out;
  uVar1 = cm_zlib_deflate(strm_00,(uint)(action == ARCHIVE_Z_FINISH) << 2);
  lastrm->next_in = strm_00->next_in;
  lastrm->avail_in = (ulong)strm_00->avail_in;
  lastrm->total_in = strm_00->total_in;
  lastrm->next_out = strm_00->next_out;
  lastrm->avail_out = (ulong)strm_00->avail_out;
  lastrm->total_out = strm_00->total_out;
  if (uVar1 == 0) {
    a_local._4_4_ = 0;
  }
  else if (uVar1 == 1) {
    a_local._4_4_ = 1;
  }
  else {
    archive_set_error(a,-1,"GZip compression failed: deflate() call returned status %d",(ulong)uVar1
                     );
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_code_deflate(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	z_stream *strm;
	int r;

	strm = (z_stream *)lastrm->real_stream;
	/* zlib.h is not const-correct, so we need this one bit
	 * of ugly hackery to convert a const * pointer to
	 * a non-const pointer. */
	strm->next_in = (Bytef *)(uintptr_t)(const void *)lastrm->next_in;
	strm->avail_in = (uInt)lastrm->avail_in;
	strm->total_in = (uLong)lastrm->total_in;
	strm->next_out = lastrm->next_out;
	strm->avail_out = (uInt)lastrm->avail_out;
	strm->total_out = (uLong)lastrm->total_out;
	r = deflate(strm,
	    (action == ARCHIVE_Z_FINISH)? Z_FINISH: Z_NO_FLUSH);
	lastrm->next_in = strm->next_in;
	lastrm->avail_in = strm->avail_in;
	lastrm->total_in = strm->total_in;
	lastrm->next_out = strm->next_out;
	lastrm->avail_out = strm->avail_out;
	lastrm->total_out = strm->total_out;
	switch (r) {
	case Z_OK:
		return (ARCHIVE_OK);
	case Z_STREAM_END:
		return (ARCHIVE_EOF);
	default:
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "GZip compression failed:"
		    " deflate() call returned status %d", r);
		return (ARCHIVE_FATAL);
	}
}